

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_array_scan_state.cpp
# Opt level: O1

void __thiscall
duckdb::ArrowArrayScanState::AddDictionary
          (ArrowArrayScanState *this,
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *dictionary_p,
          ArrowArray *arrow_dict)

{
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var4;
  pointer pVVar5;
  VectorBuffer *pVVar6;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var7;
  shared_ptr<duckdb::VectorBuffer,_true> local_28;
  
  _Var1._M_head_impl =
       (dictionary_p->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  (dictionary_p->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  __ptr._M_head_impl =
       (this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  (this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (__ptr._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&this->dictionary,__ptr._M_head_impl);
  }
  (this->arrow_dictionary).ptr = arrow_dict;
  pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     (&this->dictionary);
  local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pVVar5->buffer).internal.
       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (pVVar5->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&local_28);
  _Var7._M_head_impl = (VectorAuxiliaryData *)operator_new(0x20);
  peVar2 = (this->owned_data).internal.
           super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->owned_data).internal.
           super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (_Var7._M_head_impl)->type = ARROW_AUXILIARY;
  (_Var7._M_head_impl)->_vptr_VectorAuxiliaryData = (_func_int **)&PTR__ArrowAuxiliaryData_019b3d60;
  _Var7._M_head_impl[1]._vptr_VectorAuxiliaryData = (_func_int **)peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var7._M_head_impl + 1) + 8) = p_Var3;
  _Var4._M_head_impl =
       (pVVar6->aux_data).
       super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
  (pVVar6->aux_data).
  super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var4._M_head_impl != (VectorAuxiliaryData *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
  }
  if (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ArrowArrayScanState::AddDictionary(unique_ptr<Vector> dictionary_p, ArrowArray *arrow_dict) {
	dictionary = std::move(dictionary_p);
	D_ASSERT(owned_data);
	D_ASSERT(arrow_dict);
	arrow_dictionary = arrow_dict;
	// Make sure the data referenced by the dictionary stays alive
	dictionary->GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(owned_data));
}